

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::StoreAnimations(ColladaLoader *this,aiScene *pScene,ColladaParser *pParser)

{
  undefined1 auVar1 [16];
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  aiAnimation *paVar5;
  reference ppaVar6;
  aiAnimation *paVar7;
  char *pcVar8;
  reference pvVar9;
  size_type sVar10;
  aiNodeAnim **ppaVar11;
  ulong uVar12;
  _Base_ptr p_Var13;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar14;
  __normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
  local_5e0;
  __normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
  local_5d8;
  const_iterator local_5d0;
  aiAnimation *local_5c8;
  aiAnimation *srcAnimation_1;
  size_t b_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  aiString local_56c;
  aiAnimation *local_168;
  aiAnimation *combinedAnim;
  _Base_ptr local_158;
  undefined1 local_150;
  _Self local_148;
  _Self local_140;
  allocator<char> local_131;
  undefined1 local_130 [8];
  string channelName;
  aiAnimation *srcAnimation;
  size_t b_1;
  bool collectedAnimationsHaveDifferentChannels;
  allocator<char> local_e1;
  value_type local_e0;
  undefined1 local_c0 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  animTargets;
  aiAnimation *other;
  size_t b;
  vector<unsigned_long,_std::allocator<unsigned_long>_> collectedAnimIndices;
  aiAnimation *templateAnim;
  size_t a;
  allocator<char> local_41;
  string local_40;
  ColladaParser *local_20;
  ColladaParser *pParser_local;
  aiScene *pScene_local;
  ColladaLoader *this_local;
  
  local_20 = pParser;
  pParser_local = (ColladaParser *)pScene;
  pScene_local = (aiScene *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  StoreAnimations(this,pScene,pParser,&pParser->mAnims,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  templateAnim = (aiAnimation *)0x0;
  do {
    paVar5 = (aiAnimation *)
             std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->mAnims);
    if (paVar5 <= templateAnim) {
      bVar4 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::empty(&this->mAnims);
      if (!bVar4) {
        sVar10 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->mAnims);
        (pParser_local->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)sVar10;
        sVar10 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->mAnims);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar10;
        uVar12 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar12 = 0xffffffffffffffff;
        }
        p_Var13 = (_Base_ptr)operator_new__(uVar12);
        (pParser_local->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             p_Var13;
        __first = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::begin(&this->mAnims);
        __last = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::end(&this->mAnims);
        std::
        copy<__gnu_cxx::__normal_iterator<aiAnimation**,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>,aiAnimation**>
                  ((__normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                    )__first._M_current,
                   (__normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                    )__last._M_current,
                   (aiAnimation **)
                   (pParser_local->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent);
      }
      std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::clear(&this->mAnims);
      return;
    }
    ppaVar6 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                        (&this->mAnims,(size_type)templateAnim);
    collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*ppaVar6;
    if (((value_type)
        collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage)->mNumChannels == 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
      other = templateAnim;
      while( true ) {
        other = (aiAnimation *)((long)&(other->mName).length + 1);
        paVar5 = other;
        paVar7 = (aiAnimation *)
                 std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::size(&this->mAnims);
        if (paVar7 <= paVar5) break;
        ppaVar6 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                            (&this->mAnims,(size_type)other);
        animTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppaVar6;
        if (((value_type)animTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->mNumChannels
            == 1) {
          if ((((value_type)animTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->mDuration
               == (double)collectedAnimIndices.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage[0x81]) &&
             (!NAN(((value_type)animTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->
                   mDuration) &&
              !NAN((double)collectedAnimIndices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage[0x81]))) {
            if ((((value_type)animTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->
                 mTicksPerSecond ==
                 (double)collectedAnimIndices.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[0x82]) &&
               (!NAN(((value_type)animTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)->
                     mTicksPerSecond) &&
                !NAN((double)collectedAnimIndices.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage[0x82]))) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b,
                         (value_type_conflict7 *)&other);
            }
          }
        }
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c0);
      pcVar8 = aiString::C_Str(*(aiString **)
                                collectedAnimIndices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage[0x84]);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar8,&local_e1);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c0,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      bVar4 = true;
      for (srcAnimation = (aiAnimation *)0x0;
          paVar5 = (aiAnimation *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b),
          srcAnimation < paVar5;
          srcAnimation = (aiAnimation *)((long)&(srcAnimation->mName).length + 1)) {
        pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b,
                            (size_type)srcAnimation);
        ppaVar6 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                            (&this->mAnims,*pvVar9);
        channelName.field_2._8_8_ = *ppaVar6;
        pcVar8 = aiString::C_Str(&(*((value_type)channelName.field_2._8_8_)->mChannels)->mNodeName);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_130,pcVar8,&local_131);
        std::allocator<char>::~allocator(&local_131);
        local_140._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c0,(key_type *)local_130);
        local_148._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0);
        bVar3 = std::operator==(&local_140,&local_148);
        if (bVar3) {
          pVar14 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_c0,(value_type *)local_130);
          local_158 = (_Base_ptr)pVar14.first._M_node;
          local_150 = pVar14.second;
          combinedAnim._4_4_ = 0;
        }
        else {
          bVar4 = false;
          combinedAnim._4_4_ = 8;
        }
        std::__cxx11::string::~string((string *)local_130);
        if (combinedAnim._4_4_ != 0) break;
      }
      if (bVar4) {
        bVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
        if (!bVar4) {
          paVar5 = (aiAnimation *)operator_new(0x448);
          aiAnimation::aiAnimation(paVar5);
          local_168 = paVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5b0,"combinedAnim_",(allocator<char> *)((long)&b_2 + 7));
          std::operator+(&local_590,&local_5b0,(char)templateAnim + '0');
          aiString::aiString(&local_56c,&local_590);
          aiString::operator=(&local_168->mName,&local_56c);
          std::__cxx11::string::~string((string *)&local_590);
          std::__cxx11::string::~string((string *)&local_5b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&b_2 + 7));
          local_168->mDuration =
               (double)collectedAnimIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[0x81];
          local_168->mTicksPerSecond =
               (double)collectedAnimIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage[0x82];
          sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
          local_168->mNumChannels = (int)sVar10 + 1;
          ppaVar11 = (aiNodeAnim **)operator_new__((ulong)local_168->mNumChannels << 3);
          puVar2 = collectedAnimIndices.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          local_168->mChannels = ppaVar11;
          *local_168->mChannels =
               *(aiNodeAnim **)
                collectedAnimIndices.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[0x84];
          *(undefined8 *)
           collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage[0x84] = 0;
          if (collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            aiAnimation::~aiAnimation
                      ((aiAnimation *)
                       collectedAnimIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
            operator_delete(puVar2,0x448);
          }
          paVar5 = local_168;
          ppaVar6 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                              (&this->mAnims,(size_type)templateAnim);
          *ppaVar6 = paVar5;
          for (srcAnimation_1 = (aiAnimation *)0x0; paVar5 = srcAnimation_1,
              paVar7 = (aiAnimation *)
                       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b),
              paVar5 < paVar7;
              srcAnimation_1 = (aiAnimation *)((long)&(srcAnimation_1->mName).length + 1)) {
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b,
                                (size_type)srcAnimation_1);
            ppaVar6 = std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::operator[]
                                (&this->mAnims,*pvVar9);
            paVar5 = *ppaVar6;
            local_168->mChannels[(long)((long)&(srcAnimation_1->mName).length + 1)] =
                 *paVar5->mChannels;
            *paVar5->mChannels = (aiNodeAnim *)0x0;
            local_5c8 = paVar5;
            if (paVar5 != (aiAnimation *)0x0) {
              aiAnimation::~aiAnimation(paVar5);
              operator_delete(paVar5,0x448);
            }
          }
          while (bVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b),
                ((bVar4 ^ 0xffU) & 1) != 0) {
            local_5e0._M_current =
                 (aiAnimation **)
                 std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::begin(&this->mAnims);
            pvVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
            local_5d8 = __gnu_cxx::
                        __normal_iterator<aiAnimation_**,_std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>_>
                        ::operator+(&local_5e0,*pvVar9);
            __gnu_cxx::
            __normal_iterator<aiAnimation*const*,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>
            ::__normal_iterator<aiAnimation**>
                      ((__normal_iterator<aiAnimation*const*,std::vector<aiAnimation*,std::allocator<aiAnimation*>>>
                        *)&local_5d0,&local_5d8);
            std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::erase
                      (&this->mAnims,local_5d0);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
          }
        }
        combinedAnim._4_4_ = 0;
      }
      else {
        combinedAnim._4_4_ = 4;
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&b);
    }
    templateAnim = (aiAnimation *)((long)&(templateAnim->mName).length + 1);
  } while( true );
}

Assistant:

void ColladaLoader::StoreAnimations( aiScene* pScene, const ColladaParser& pParser) {
    // recursively collect all animations from the collada scene
    StoreAnimations(pScene, pParser, &pParser.mAnims, "");

    // catch special case: many animations with the same length, each affecting only a single node.
    // we need to unite all those single-node-anims to a proper combined animation
    for(size_t a = 0; a < mAnims.size(); ++a) {
        aiAnimation* templateAnim = mAnims[a];

        if (templateAnim->mNumChannels == 1) {
            // search for other single-channel-anims with the same duration
            std::vector<size_t> collectedAnimIndices;
            for( size_t b = a+1; b < mAnims.size(); ++b) {
                aiAnimation* other = mAnims[b];
                if (other->mNumChannels == 1 && other->mDuration == templateAnim->mDuration &&
                    other->mTicksPerSecond == templateAnim->mTicksPerSecond)
						collectedAnimIndices.push_back(b);
            }

			// We only want to combine the animations if they have different channels
			std::set<std::string> animTargets;
			animTargets.insert(templateAnim->mChannels[0]->mNodeName.C_Str());
			bool collectedAnimationsHaveDifferentChannels = true;
			for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
			{
				aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
				std::string channelName = std::string(srcAnimation->mChannels[0]->mNodeName.C_Str());
				if (animTargets.find(channelName) == animTargets.end()) {
					animTargets.insert(channelName);
				} else {
					collectedAnimationsHaveDifferentChannels = false;
					break;
				}
			}

			if (!collectedAnimationsHaveDifferentChannels)
				continue;

            // if there are other animations which fit the template anim, combine all channels into a single anim
            if (!collectedAnimIndices.empty())
            {
                aiAnimation* combinedAnim = new aiAnimation();
                combinedAnim->mName = aiString(std::string("combinedAnim_") + char('0' + a));
                combinedAnim->mDuration = templateAnim->mDuration;
                combinedAnim->mTicksPerSecond = templateAnim->mTicksPerSecond;
                combinedAnim->mNumChannels = static_cast<unsigned int>(collectedAnimIndices.size() + 1);
                combinedAnim->mChannels = new aiNodeAnim*[combinedAnim->mNumChannels];
                // add the template anim as first channel by moving its aiNodeAnim to the combined animation
                combinedAnim->mChannels[0] = templateAnim->mChannels[0];
                templateAnim->mChannels[0] = NULL;
                delete templateAnim;
                // combined animation replaces template animation in the anim array
                mAnims[a] = combinedAnim;

                // move the memory of all other anims to the combined anim and erase them from the source anims
                for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
                {
                    aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
                    combinedAnim->mChannels[1 + b] = srcAnimation->mChannels[0];
                    srcAnimation->mChannels[0] = NULL;
                    delete srcAnimation;
                }

                // in a second go, delete all the single-channel-anims that we've stripped from their channels
                // back to front to preserve indices - you know, removing an element from a vector moves all elements behind the removed one
                while (!collectedAnimIndices.empty())
                {
                    mAnims.erase(mAnims.begin() + collectedAnimIndices.back());
                    collectedAnimIndices.pop_back();
                }
            }
        }
    }

    // now store all anims in the scene
    if (!mAnims.empty())
    {
        pScene->mNumAnimations = static_cast<unsigned int>(mAnims.size());
        pScene->mAnimations = new aiAnimation*[mAnims.size()];
        std::copy(mAnims.begin(), mAnims.end(), pScene->mAnimations);
    }

    mAnims.clear();
}